

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

bool filemgr_invalidate_block(filemgr *file,bid_t bid)

{
  uint64_t uVar1;
  atomic<unsigned_long> *in_RSI;
  long in_RDI;
  byte bVar2;
  bool ret;
  bid_t in_stack_00000060;
  filemgr *in_stack_00000068;
  memory_order in_stack_ffffffffffffffec;
  
  uVar1 = atomic_get_uint64_t(in_RSI,in_stack_ffffffffffffffec);
  bVar2 = uVar1 < (long)in_RSI * (ulong)*(uint *)(in_RDI + 0x10);
  if (0 < global_config.ncacheblock) {
    bcache_invalidate_block(in_stack_00000068,in_stack_00000060);
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool filemgr_invalidate_block(struct filemgr *file, bid_t bid)
{
    bool ret;
    if (atomic_get_uint64_t(&file->last_commit) < bid * file->blocksize) {
        ret = true; // block invalidated was allocated recently (uncommitted)
    } else {
        ret = false; // a block from the past is invalidated (committed)
    }
    if (global_config.ncacheblock > 0) {
        bcache_invalidate_block(file, bid);
    }
    return ret;
}